

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall ThreadPool::clear(ThreadPool *this)

{
  _List_node_base *p_Var1;
  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *this_00;
  
  std::mutex::lock(&this->_taskInfo);
  this_00 = &this->_task;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))(p_Var1[1]._M_next,1);
  }
  std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::clear
            (this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
  return;
}

Assistant:

void ThreadPool::clear()
{
    _taskInfo.lock();
    // complete all tasks without real computations. It helps to avoid a deadlock in a case when thread pool is destroyed
    std::for_each( _task.begin(), _task.end(), []( AbstractTaskProvider * task ) { task->_task( true ); } );
    _task.clear();

    _taskInfo.unlock();
}